

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::paintEvent(QGraphicsView *this,QPaintEvent *event)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data *pDVar6;
  long *plVar7;
  char cVar8;
  int iVar9;
  undefined4 uVar10;
  QWidget *pQVar11;
  undefined8 *puVar12;
  long lVar13;
  QPaintDevice *pQVar14;
  QTransform *pQVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  bool viewTransformed;
  QPainter painter;
  QGraphicsViewPrivate *d;
  QTransform viewTransform;
  anon_class_48_6_1c4006f9 local_e8;
  bool local_b1;
  undefined1 local_b0 [12];
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QGraphicsViewPrivate *local_88;
  QTransform local_80;
  long local_30;
  
  bVar16 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar6 = (local_88->scene).wp.d;
  if (((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) ||
     ((local_88->scene).wp.value == (QObject *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QAbstractScrollArea::paintEvent((QAbstractScrollArea *)this,event);
      return;
    }
  }
  else {
    lVar13 = *(long *)((local_88->scene).wp.value + 8);
    *(uint *)(lVar13 + 0xb8) =
         (*(uint *)(lVar13 + 0xb8) & 0xffffbfff |
         ((local_88->optimizationFlags).
          super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
          super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 1) << 0xe) ^ 0x4000;
    QRegion::operator=(&local_88->exposedRegion,(QRegion *)(event + 0x20));
    local_98 = 0xffffffff;
    uStack_94 = 0xffffffff;
    uStack_90 = 0xffffffff;
    uStack_8c = 0xffffffff;
    local_b0._8_4_ = 0xffffffff;
    uStack_a4 = 0xffffffff;
    uStack_a0 = 0xffffffff;
    uStack_9c = 0xffffffff;
    local_e8._0_16_ = QRegion::boundingRect();
    mapToScene((QPolygonF *)&local_80,this,(QRect *)&local_e8);
    QPolygonF::boundingRect();
    if ((QArrayData *)local_80.m_matrix[0][0] != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_80.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_80.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_80.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_80.m_matrix[0][0],0x10,0x10);
      }
    }
    local_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar14 = &pQVar11->super_QPaintDevice;
    if (pQVar11 == (QWidget *)0x0) {
      pQVar14 = (QPaintDevice *)0x0;
    }
    QPainter::QPainter((QPainter *)local_b0,pQVar14);
    if ((local_88->rubberBanding == true) &&
       (uVar2 = (local_88->rubberBandRect).x1, uVar4 = (local_88->rubberBandRect).y1,
       uVar3 = (local_88->rubberBandRect).x2, uVar5 = (local_88->rubberBandRect).y2,
       auVar17._0_4_ = -(uint)((int)uVar3 < (int)uVar2), auVar17._4_4_ = auVar17._0_4_,
       auVar17._8_4_ = -(uint)((int)uVar5 < (int)uVar4),
       auVar17._12_4_ = -(uint)((int)uVar5 < (int)uVar4), iVar9 = movmskpd((int)local_88,auVar17),
       iVar9 == 0)) {
      QPainter::save();
    }
    uVar10 = QPainter::renderHints();
    QPainter::setRenderHints((QPainter *)local_b0,uVar10,0);
    QPainter::setRenderHints
              ((QPainter *)local_b0,
               (local_88->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
               super_QFlagsStorage<QPainter::RenderHint>.i,1);
    local_b1 = isTransformed(this);
    if (local_b1) {
      viewportTransform(&local_80,this);
      QPainter::setWorldTransform((QTransform *)local_b0,SUB81(&local_80,0));
    }
    puVar12 = &DAT_00704bf8;
    pQVar15 = &local_80;
    for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (((QList<QPointF> *)pQVar15->m_matrix)->d).d = (Data *)*puVar12;
      puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
      pQVar15 = (QTransform *)((long)pQVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    puVar12 = (undefined8 *)QPainter::worldTransform();
    pQVar15 = &local_80;
    for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (((QList<QPointF> *)pQVar15->m_matrix)->d).d = (Data *)*puVar12;
      puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
      pQVar15 = (QTransform *)((long)pQVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    local_e8.d = &local_88;
    local_e8.viewTransformed = &local_b1;
    local_e8.this = (QGraphicsView *)this;
    local_e8.viewTransform = &local_80;
    local_e8.painter = (QPainter *)local_b0;
    local_e8.exposedSceneRect = (QRectF *)(local_b0 + 8);
    paintEvent::anon_class_48_6_1c4006f9::operator()(&local_e8);
    if (local_88->stereoEnabled == true) {
      pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      plVar7 = *(long **)&pQVar11->field_0x8;
      cVar8 = (**(code **)(*plVar7 + 0xa0))(plVar7);
      if (cVar8 != '\0') {
        paintEvent::anon_class_48_6_1c4006f9::operator()(&local_e8);
        (**(code **)(*plVar7 + 0xa0))(plVar7);
      }
    }
    QPainter::end();
    puVar1 = (uint *)(*(long *)((local_88->scene).wp.value + 8) + 0xb8);
    *puVar1 = *puVar1 | 0x4000;
    QPainter::~QPainter((QPainter *)local_b0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::paintEvent(QPaintEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene) {
        QAbstractScrollArea::paintEvent(event);
        return;
    }

    // Set up painter state protection.
    d->scene->d_func()->painterStateProtection = !(d->optimizationFlags & DontSavePainterState);

    // Determine the exposed region
    d->exposedRegion = event->region();
    QRectF exposedSceneRect = mapToScene(d->exposedRegion.boundingRect()).boundingRect();

    // Set up the painter
    QPainter painter(viewport());
#if QT_CONFIG(rubberband)
    if (d->rubberBanding && !d->rubberBandRect.isEmpty())
        painter.save();
#endif
    // Set up render hints
    painter.setRenderHints(painter.renderHints(), false);
    painter.setRenderHints(d->renderHints, true);

    // Set up viewport transform
    const bool viewTransformed = isTransformed();
    if (viewTransformed)
        painter.setWorldTransform(viewportTransform());
    const QTransform viewTransform = painter.worldTransform();

    const auto actuallyDraw = [&]() {
        // Draw background
        if (d->cacheMode & CacheBackground) {
            // Recreate the background pixmap, and flag the whole background as
            // exposed.
            if (d->mustResizeBackgroundPixmap) {
                const qreal dpr = d->viewport->devicePixelRatio();
                d->backgroundPixmap = QPixmap(viewport()->size() * dpr);
                d->backgroundPixmap.setDevicePixelRatio(dpr);
                QBrush bgBrush = viewport()->palette().brush(viewport()->backgroundRole());
                if (!bgBrush.isOpaque())
                    d->backgroundPixmap.fill(Qt::transparent);
                QPainter p(&d->backgroundPixmap);
                p.fillRect(0, 0, d->backgroundPixmap.width(), d->backgroundPixmap.height(), bgBrush);
                d->backgroundPixmapExposed = QRegion(viewport()->rect());
                d->mustResizeBackgroundPixmap = false;
            }

            // Redraw exposed areas
            if (!d->backgroundPixmapExposed.isEmpty()) {
                QPainter backgroundPainter(&d->backgroundPixmap);
                backgroundPainter.setClipRegion(d->backgroundPixmapExposed, Qt::ReplaceClip);
                if (viewTransformed)
                    backgroundPainter.setTransform(viewTransform);
                QRectF backgroundExposedSceneRect = mapToScene(d->backgroundPixmapExposed.boundingRect()).boundingRect();
                drawBackground(&backgroundPainter, backgroundExposedSceneRect);
                d->backgroundPixmapExposed = QRegion();
            }

            // Blit the background from the background pixmap
            if (viewTransformed) {
                painter.setWorldTransform(QTransform());
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
                painter.setWorldTransform(viewTransform);
            } else {
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
            }
        } else {
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.save();

            drawBackground(&painter, exposedSceneRect);
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.restore();
        }

        // Items
        if (!(d->optimizationFlags & IndirectPainting)) {
            const quint32 oldRectAdjust = d->scene->d_func()->rectAdjust;
            if (d->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
                d->scene->d_func()->rectAdjust = 1;
            else
                d->scene->d_func()->rectAdjust = 2;
            d->scene->d_func()->drawItems(&painter, viewTransformed ? &viewTransform : nullptr,
                                          &d->exposedRegion, viewport());
            d->scene->d_func()->rectAdjust = oldRectAdjust;
            // Make sure the painter's world transform is restored correctly when
            // drawing without painter state protection (DontSavePainterState).
            // We only change the worldTransform() so there's no need to do a full-blown
            // save() and restore(). Also note that we don't have to do this in case of
            // IndirectPainting (the else branch), because in that case we always save()
            // and restore() in QGraphicsScene::drawItems().
            if (!d->scene->d_func()->painterStateProtection)
                painter.setOpacity(1.0);
            painter.setWorldTransform(viewTransform);
        } else {
            // Make sure we don't have unpolished items before we draw
            if (!d->scene->d_func()->unpolishedItems.isEmpty())
                d->scene->d_func()->_q_polishItems();
            // We reset updateAll here (after we've issued polish events)
            // so that we can discard update requests coming from polishEvent().
            d->scene->d_func()->updateAll = false;

            // Find all exposed items
            bool allItems = false;
            QList<QGraphicsItem *> itemList = d->findItems(d->exposedRegion, &allItems, viewTransform);
            if (!itemList.isEmpty()) {
                // Generate the style options.
                const int numItems = itemList.size();
                QGraphicsItem **itemArray = &itemList[0]; // Relies on QList internals, but is perfectly valid.
                QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
                QTransform transform(Qt::Uninitialized);
                for (int i = 0; i < numItems; ++i) {
                    QGraphicsItem *item = itemArray[i];
                    QGraphicsItemPrivate *itemd = item->d_ptr.data();
                    itemd->initStyleOption(&styleOptionArray[i], viewTransform, d->exposedRegion, allItems);
                    // Cache the item's area in view coordinates.
                    // Note that we have to do this here in case the base class implementation
                    // (QGraphicsScene::drawItems) is not called. If it is, we'll do this
                    // operation twice, but that's the price one has to pay for using indirect
                    // painting :-/.
                    const QRectF brect = adjustedItemEffectiveBoundingRect(item);
                    if (!itemd->itemIsUntransformable()) {
                        transform = item->sceneTransform();
                        if (viewTransformed)
                            transform *= viewTransform;
                    } else {
                        transform = item->deviceTransform(viewTransform);
                    }
                    itemd->paintedViewBoundingRects.insert(d->viewport, transform.mapRect(brect).toRect());
                }
                // Draw the items.
                drawItems(&painter, numItems, itemArray, styleOptionArray);
                d->freeStyleOptionsArray(styleOptionArray);
            }
        }

        // Foreground
        drawForeground(&painter, exposedSceneRect);

    #if QT_CONFIG(rubberband)
        // Rubberband
        if (d->rubberBanding && !d->rubberBandRect.isEmpty()) {
            painter.restore();
            QStyleOptionRubberBand option;
            option.initFrom(viewport());
            option.rect = d->rubberBandRect;
            option.shape = QRubberBand::Rectangle;

            QStyleHintReturnMask mask;
            if (viewport()->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, viewport(), &mask)) {
                // painter clipping for masked rubberbands
                painter.setClipRegion(mask.region, Qt::IntersectClip);
            }

            viewport()->style()->drawControl(QStyle::CE_RubberBand, &option, &painter, viewport());
        }
    #endif
    };

    actuallyDraw();

    // For stereo we want to draw everything twice, once to each buffer
    if (d->stereoEnabled) {
        QWidgetPrivate* w = QWidgetPrivate::get(viewport());
        if (w->toggleStereoTargetBuffer()) {
            actuallyDraw();
            w->toggleStereoTargetBuffer();
        }
    }

    painter.end();

    // Restore painter state protection.
    d->scene->d_func()->painterStateProtection = true;
}